

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HMMSegment.hpp
# Opt level: O0

void __thiscall
cppjieba::HMMSegment::InternalCut
          (HMMSegment *this,const_iterator begin,const_iterator end,
          vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_> *res)

{
  const_iterator pRVar1;
  size_type sVar2;
  reference pvVar3;
  const_iterator in_RSI;
  WordRange wr;
  size_t i;
  const_iterator right;
  const_iterator left;
  vector<unsigned_long,_std::allocator<unsigned_long>_> status;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_000000b8;
  const_iterator in_stack_000000c0;
  const_iterator in_stack_000000c8;
  HMMSegment *in_stack_000000d0;
  value_type *__x;
  const_iterator in_stack_ffffffffffffff90;
  ulong local_60;
  const_iterator local_50;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_38;
  const_iterator local_10;
  
  __x = (value_type *)&local_38;
  local_10 = in_RSI;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x1556ca);
  Viterbi(in_stack_000000d0,in_stack_000000c8,in_stack_000000c0,in_stack_000000b8);
  local_50 = local_10;
  local_60 = 0;
  while( true ) {
    sVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&local_38);
    if (sVar2 <= local_60) break;
    pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (&local_38,local_60);
    if ((*pvVar3 & 1) != 0) {
      pRVar1 = local_10 + local_60 + 1;
      WordRange::WordRange((WordRange *)&stack0xffffffffffffff90,local_50,pRVar1 + -1);
      std::vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>::push_back
                ((vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_> *)
                 in_stack_ffffffffffffff90,__x);
      local_50 = pRVar1;
    }
    local_60 = local_60 + 1;
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_ffffffffffffff90);
  return;
}

Assistant:

void InternalCut(RuneStrArray::const_iterator begin, RuneStrArray::const_iterator end, vector<WordRange>& res) const {
    vector<size_t> status;
    Viterbi(begin, end, status);

    RuneStrArray::const_iterator left = begin;
    RuneStrArray::const_iterator right;
    for (size_t i = 0; i < status.size(); i++) {
      if (status[i] % 2) { //if (HMMModel::E == status[i] || HMMModel::S == status[i])
        right = begin + i + 1;
        WordRange wr(left, right - 1);
        res.push_back(wr);
        left = right;
      }
    }
  }